

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall CcsTest_Import_Test::~CcsTest_Import_Test(CcsTest_Import_Test *this)

{
  CcsTest_Import_Test *this_local;
  
  ~CcsTest_Import_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CcsTest, Import) {
  CcsDomain ccs;
  std::istringstream input("@import 'foo'");
  StringImportResolver ir("baz.bar: frob = 'nitz'");
  ccs.loadCcsStream(input, "<literal>", ir);
  CcsContext ctx = ccs.build().constrain("baz", v("bar"));
  ASSERT_NO_THROW(EXPECT_EQ("nitz", ctx.getString("frob")));
}